

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.cpp
# Opt level: O1

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  int iVar1;
  lua_State *L;
  lua_State *plVar2;
  
  L = (lua_State *)(*f)(ud,(void *)0x0,0,0x268);
  plVar2 = (lua_State *)0x0;
  if (L != (lua_State *)0x0) {
    L->next = (GCObject *)0x0;
    L->tt = '\b';
    *(undefined1 *)&L[1].l_G = 0x21;
    L->marked = 'a';
    L->status = '\0';
    L->l_G = (global_State *)(L + 1);
    L->stack = (StkId)0x0;
    L->stacksize = 0;
    L->errorJmp = (lua_longjmp *)0x0;
    L->errfunc = 0;
    L->hookmask = '\0';
    L->allowhook = '\x01';
    L->basehookcount = 0;
    L->hookcount = 0;
    L->hook = (lua_Hook)0x0;
    L->openupval = (GCObject *)0x0;
    L->base_ci = (CallInfo *)0x0;
    (L->l_gt).tt = 0;
    L->ci = (CallInfo *)0x0;
    L->savedpc = (Instruction *)0x0;
    L->size_ci = 0;
    L->nCcalls = 0;
    L->baseCcalls = 0;
    L[1].top = (StkId)f;
    L[1].base = (StkId)ud;
    L[1].errfunc = (ptrdiff_t)L;
    L[2].base = (StkId)(L + 2);
    L[2].l_G = (global_State *)(L + 2);
    *(undefined4 *)&L[1].errorJmp = 0;
    L[1].stacksize = 0;
    L[1].size_ci = 0;
    L[1].openupval = (GCObject *)0x0;
    *(undefined1 *)((long)&L[1].l_G + 1) = 0;
    L[1].next = (GCObject *)0x0;
    L[1].tt = '\0';
    L[1].marked = '\0';
    L[1].status = '\0';
    *(undefined5 *)&L[1].field_0xb = 0;
    L[1].basehookcount = 0;
    L[1].hookcount = 0;
    L[1].hook = (lua_Hook)0x0;
    L[1].ci = (CallInfo *)L;
    *(undefined4 *)((long)&L[1].l_G + 4) = 0;
    L[1].savedpc = (Instruction *)&L[1].ci;
    L[1].stack_last = (StkId)0x0;
    L[1].stack = (StkId)0x0;
    L[1].end_ci = (CallInfo *)0x0;
    L[1].base_ci = (CallInfo *)0x0;
    L[1].l_gt.value.n = 3.04344437838208e-321;
    *(undefined8 *)&L[1].env.tt = 0xc8000000c8;
    L[1].env.value.gc = (GCObject *)0x0;
    L[2].ci = (CallInfo *)0x0;
    L[2].savedpc = (Instruction *)0x0;
    L[2].stack_last = (StkId)0x0;
    L[2].stack = (StkId)0x0;
    L[2].end_ci = (CallInfo *)0x0;
    L[2].base_ci = (CallInfo *)0x0;
    L[2].stacksize = 0;
    L[2].size_ci = 0;
    L[2].nCcalls = 0;
    L[2].baseCcalls = 0;
    L[2].hookmask = '\0';
    L[2].allowhook = '\0';
    *(undefined2 *)&L[2].field_0x66 = 0;
    L[2].basehookcount = 0;
    L[2].hookcount = 0;
    iVar1 = luaD_rawrunprotected(L,f_luaopen,(void *)0x0);
    plVar2 = L;
    if (iVar1 != 0) {
      close_state(L);
      plVar2 = (lua_State *)0x0;
    }
  }
  return plVar2;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;
  void *l = (*f)(ud, NULL, 0, state_size(LG));
  if (l == NULL) return NULL;
  L = tostate(l);
  g = &((LG *)L)->g;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bit2mask(WHITE0BIT, FIXEDBIT);
  L->marked = luaC_white(g);
  set2bits(L->marked, FIXEDBIT, SFIXEDBIT);
  preinit_state(L, g);
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->uvhead.u.l.prev = &g->uvhead;
  g->uvhead.u.l.next = &g->uvhead;
  g->GCthreshold = 0;  /* mark it as unfinished state */
  g->strt.size = 0;
  g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(registry(L));
  luaZ_initbuffer(L, &g->buff);
  g->panic = NULL;
  g->gcstate = GCSpause;
  g->rootgc = obj2gco(L);
  g->sweepstrgc = 0;
  g->sweepgc = &g->rootgc;
  g->gray = NULL;
  g->grayagain = NULL;
  g->weak = NULL;
  g->tmudata = NULL;
  g->totalbytes = sizeof(LG);
  g->gcpause = LUAI_GCPAUSE;
  g->gcstepmul = LUAI_GCMUL;
  g->gcdept = 0;
  for (i=0; i<NUM_TAGS; i++) g->mt[i] = NULL;
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != 0) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
  else
    luai_userstateopen(L);
  return L;
}